

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_testFailureWithAmpersands_TestShell::
~TEST_JUnitOutputTest_testFailureWithAmpersands_TestShell
          (TEST_JUnitOutputTest_testFailureWithAmpersands_TestShell *this)

{
  TEST_JUnitOutputTest_testFailureWithAmpersands_TestShell *this_local;
  
  ~TEST_JUnitOutputTest_testFailureWithAmpersands_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithAmpersands)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("&object1 != &object2", "importantFile", 999)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"importantFile:999: &amp;object1 != &amp;object2\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}